

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                  void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                  float scale_max,ImVec2 frame_size)

{
  ImVec2 *p;
  ImU32 IVar1;
  ImVec2 p_max;
  bool bVar2;
  ImGuiID id;
  ImU32 IVar3;
  ImU32 IVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ImGuiContext *pIVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  ImVec2 pos;
  undefined4 in_XMM1_Db;
  float fVar15;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar16;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_f8;
  ImVec2 local_e0;
  ImGuiContext *local_d8;
  ImGuiWindow *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  
  pIVar10 = GImGui;
  local_d0 = GImGui->CurrentWindow;
  local_d0->WriteAccessed = true;
  if (local_d0->SkipItems != false) {
    return;
  }
  local_c8._4_4_ = in_XMM1_Db;
  local_c8._0_4_ = scale_max;
  local_c8._8_4_ = in_XMM1_Dc;
  local_c8._12_4_ = in_XMM1_Dd;
  uStack_b0 = in_XMM2_Dc;
  local_b8 = (undefined1  [8])frame_size;
  uStack_ac = in_XMM2_Dd;
  id = ImGuiWindow::GetID(local_d0,label,(char *)0x0);
  IVar14 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar11 = (float)local_b8._0_4_;
  if (((float)local_b8._0_4_ == 0.0) && (!NAN((float)local_b8._0_4_))) {
    fVar11 = CalcItemWidth();
  }
  fVar20 = IVar14.x;
  if (((float)local_b8._4_4_ != 0.0) || (NAN((float)local_b8._4_4_))) {
    fVar13 = (pIVar10->Style).FramePadding.y;
  }
  else {
    fVar13 = (pIVar10->Style).FramePadding.y;
    local_b8._4_4_ = fVar13 + fVar13 + IVar14.y;
  }
  frame_bb.Min.x = (local_d0->DC).CursorPos.x;
  frame_bb.Min.y = (local_d0->DC).CursorPos.y;
  local_b8._0_4_ = fVar11;
  frame_bb.Max.x = fVar11 + frame_bb.Min.x;
  frame_bb.Max.y = (float)local_b8._4_4_ + frame_bb.Min.y;
  fVar11 = (pIVar10->Style).FramePadding.x;
  inner_bb.Min.x = fVar11 + frame_bb.Min.x;
  inner_bb.Min.y = frame_bb.Min.y + fVar13;
  inner_bb.Max.x = frame_bb.Max.x - fVar11;
  inner_bb.Max.y = frame_bb.Max.y - fVar13;
  fVar11 = 0.0;
  if (0.0 < fVar20) {
    fVar11 = (pIVar10->Style).ItemInnerSpacing.x + fVar20;
  }
  total_bb.Max.x = frame_bb.Max.x + fVar11;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  local_d8 = pIVar10;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,fVar13);
  pIVar10 = local_d8;
  bVar2 = ItemAdd(&total_bb,0,&frame_bb);
  if (!bVar2) {
    return;
  }
  bVar2 = ItemHoverable(&frame_bb,id);
  if ((scale_min != 3.4028235e+38) || (NAN(scale_min))) {
    local_f8 = scale_min;
    if (((float)local_c8._0_4_ != 3.4028235e+38) || (NAN((float)local_c8._0_4_))) goto LAB_0017c76e;
  }
  iVar9 = 0;
  iVar5 = 0;
  if (0 < values_count) {
    iVar5 = values_count;
  }
  fVar11 = 3.4028235e+38;
  fVar13 = -3.4028235e+38;
  for (; iVar5 != iVar9; iVar9 = iVar9 + 1) {
    fVar12 = (*values_getter)(data,iVar9);
    if (!NAN(fVar12)) {
      if (fVar12 <= fVar11) {
        fVar11 = fVar12;
      }
      fVar13 = (float)((uint)fVar13 & -(uint)(fVar12 <= fVar13) |
                      ~-(uint)(fVar12 <= fVar13) & (uint)fVar12);
    }
  }
  local_f8 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                    (uint)fVar11 & -(uint)(scale_min == 3.4028235e+38));
  local_c8._0_4_ =
       ~-(uint)((float)local_c8._0_4_ == 3.4028235e+38) & local_c8._0_4_ |
       (uint)fVar13 & -(uint)((float)local_c8._0_4_ == 3.4028235e+38);
  pIVar10 = local_d8;
LAB_0017c76e:
  IVar14.y = frame_bb.Min.y;
  IVar14.x = frame_bb.Min.x;
  p_max.y = frame_bb.Max.y;
  p_max.x = frame_bb.Max.x;
  IVar3 = GetColorU32(7,1.0);
  RenderFrame(IVar14,p_max,IVar3,true,(pIVar10->Style).FrameRounding);
  if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
    iVar5 = (int)(float)local_b8._0_4_;
    if (values_count <= (int)(float)local_b8._0_4_) {
      iVar5 = values_count;
    }
    iVar5 = iVar5 - (uint)(plot_type == ImGuiPlotType_Lines);
    iVar9 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
    uVar7 = 0xffffffff;
    if (bVar2) {
      p = &(local_d8->IO).MousePos;
      bVar2 = ImRect::Contains(&inner_bb,p);
      if (bVar2) {
        fVar13 = (p->x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
        fVar11 = 0.9999;
        if (fVar13 <= 0.9999) {
          fVar11 = fVar13;
        }
        uVar7 = (uint)((float)iVar9 * (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar11));
        fVar11 = (*values_getter)(data,(int)(values_offset + uVar7) % values_count);
        (*values_getter)(data,(int)(values_offset + uVar7 + 1) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar7,(ulong)(uVar7 + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)fVar11,(ulong)uVar7);
        }
      }
    }
    _local_b8 = ZEXT416(~-(uint)(local_f8 == (float)local_c8._0_4_) &
                        (uint)(1.0 / ((float)local_c8._0_4_ - local_f8)));
    fVar11 = (*values_getter)(data,values_offset % values_count);
    fVar13 = (fVar11 - local_f8) * (float)local_b8._0_4_;
    fVar11 = 1.0;
    if (fVar13 <= 1.0) {
      fVar11 = fVar13;
    }
    if (0.0 <= (float)local_c8._0_4_ * local_f8) {
      fVar12 = (float)(~-(uint)(local_f8 < 0.0) & 0x3f800000);
    }
    else {
      fVar12 = -local_f8 * (float)local_b8._0_4_;
    }
    local_c8 = ZEXT416((uint)(1.0 / (float)iVar5));
    IVar3 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x28,1.0);
    IVar4 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x29,1.0);
    iVar6 = 0;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    fVar17 = 0.0;
    fVar11 = (float)(-(uint)(fVar13 < 0.0) & 0x3f800000 |
                    ~-(uint)(fVar13 < 0.0) & (uint)(1.0 - fVar11));
    while (bVar2 = iVar6 != 0, iVar6 = iVar6 + -1, bVar2) {
      uVar8 = (uint)(fVar17 * (float)iVar9 + 0.5);
      fVar13 = (*values_getter)(data,(int)(values_offset + 1 + uVar8) % values_count);
      fVar18 = (float)local_c8._0_4_ + fVar17;
      fVar19 = (fVar13 - local_f8) * (float)local_b8._0_4_;
      fVar13 = 1.0;
      if (fVar19 <= 1.0) {
        fVar13 = fVar19;
      }
      fVar13 = (float)(-(uint)(fVar19 < 0.0) & 0x3f800000 |
                      ~-(uint)(fVar19 < 0.0) & (uint)(1.0 - fVar13));
      fVar16 = inner_bb.Min.x;
      local_e0.y = inner_bb.Min.y;
      fVar19 = inner_bb.Max.x - fVar16;
      fVar15 = inner_bb.Max.y - local_e0.y;
      fVar21 = fVar17 * fVar19 + fVar16;
      pos0.y = fVar11 * fVar15 + local_e0.y;
      pos0.x = fVar21;
      local_e0.x = fVar19 * fVar18 + fVar16;
      fVar17 = fVar18;
      fVar11 = fVar13;
      if (plot_type == ImGuiPlotType_Lines) {
        local_e0.y = fVar15 * fVar13 + local_e0.y;
        IVar1 = IVar3;
        if (uVar7 == uVar8) {
          IVar1 = IVar4;
        }
        ImDrawList::AddLine(local_d0->DrawList,&pos0,&local_e0,IVar1,1.0);
      }
      else {
        local_e0.y = fVar15 * fVar12 + local_e0.y;
        if (plot_type == ImGuiPlotType_Histogram) {
          if (fVar21 + 2.0 <= local_e0.x) {
            local_e0.x = local_e0.x + -1.0;
          }
          IVar1 = IVar3;
          if (uVar7 == uVar8) {
            IVar1 = IVar4;
          }
          ImDrawList::AddRectFilled(local_d0->DrawList,&pos0,&local_e0,IVar1,0.0,0xf);
        }
      }
    }
  }
  pIVar10 = local_d8;
  if (overlay_text != (char *)0x0) {
    pos0.y = frame_bb.Min.y + (local_d8->Style).FramePadding.y;
    pos0.x = frame_bb.Min.x;
    local_e0.x = 0.5;
    local_e0.y = 0.0;
    RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_e0,
                      (ImRect *)0x0);
  }
  if (0.0 < fVar20) {
    pos.x = frame_bb.Max.x + (pIVar10->Style).ItemInnerSpacing.x;
    pos.y = inner_bb.Min.y;
    RenderText(pos,label,(char *)0x0,true);
  }
  return;
}

Assistant:

void ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        int v_hovered = -1;
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            v_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, v_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);
}